

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O2

void Iso_ManRehashClassNodes(Iso_Man_t *p)

{
  Iso_Obj_t *pIVar1;
  void *pvVar2;
  int iVar3;
  
  p->vTemp1->nSize = 0;
  p->vTemp2->nSize = 0;
  for (iVar3 = 0; iVar3 < p->vClasses->nSize; iVar3 = iVar3 + 1) {
    for (pIVar1 = (Iso_Obj_t *)Vec_PtrEntry(p->vClasses,iVar3); pIVar1 != (Iso_Obj_t *)0x0;
        pIVar1 = Iso_ManObj(p,pIVar1->iClass)) {
      Vec_PtrPush((&p->vTemp1)[pIVar1->Id != 0],pIVar1);
    }
  }
  p->nClasses = 0;
  p->nEntries = 0;
  p->nSingles = 0;
  iVar3 = 0;
  memset(p->pBins,0,(long)p->nBins << 2);
  while( true ) {
    if (p->vTemp1->nSize <= iVar3) {
      iVar3 = 0;
      while( true ) {
        if (p->vTemp2->nSize <= iVar3) {
          Iso_ManCollectClasses(p);
          return;
        }
        pvVar2 = Vec_PtrEntry(p->vTemp2,iVar3);
        if (*(int *)((long)pvVar2 + 0x14) == 0) break;
        *(undefined8 *)((long)pvVar2 + 0xc) = 0;
        iVar3 = iVar3 + 1;
      }
      __assert_fail("pTemp->Id != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                    ,0x3de,"void Iso_ManRehashClassNodes(Iso_Man_t *)");
    }
    pIVar1 = (Iso_Obj_t *)Vec_PtrEntry(p->vTemp1,iVar3);
    if (pIVar1->Id != 0) break;
    pIVar1->iNext = 0;
    pIVar1->iClass = 0;
    Iso_ObjHashAdd(p,pIVar1);
    iVar3 = iVar3 + 1;
  }
  __assert_fail("pTemp->Id == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                ,0x3d8,"void Iso_ManRehashClassNodes(Iso_Man_t *)");
}

Assistant:

void Iso_ManRehashClassNodes( Iso_Man_t * p )
{
    Iso_Obj_t * pIso, * pTemp;
    int i;
    // collect nodes
    Vec_PtrClear( p->vTemp1 );
    Vec_PtrClear( p->vTemp2 );
    Vec_PtrForEachEntry( Iso_Obj_t *, p->vClasses, pIso, i )
    {
        for ( pTemp = pIso; pTemp; pTemp = Iso_ManObj(p, pTemp->iClass) )
            if ( pTemp->Id == 0 )
                Vec_PtrPush( p->vTemp1, pTemp );
            else
                Vec_PtrPush( p->vTemp2, pTemp );
    }
    // clean and add nodes
    p->nClasses = 0;       // total number of classes
    p->nEntries = 0;       // total number of entries
    p->nSingles = 0;       // total number of singletons
    memset( p->pBins, 0, sizeof(int) * p->nBins );
    Vec_PtrForEachEntry( Iso_Obj_t *, p->vTemp1, pTemp, i )
    {
        assert( pTemp->Id == 0 );
        pTemp->iClass = pTemp->iNext = 0;
        Iso_ObjHashAdd( p, pTemp );
    }
    Vec_PtrForEachEntry( Iso_Obj_t *, p->vTemp2, pTemp, i )
    {
        assert( pTemp->Id != 0 );
        pTemp->iClass = pTemp->iNext = 0;
    }
    // collect new classes
    Iso_ManCollectClasses( p );
}